

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnns_index.h
# Opt level: O1

void __thiscall
gnns::Gnns_Index<L2Distance<float>_>::setDataset
          (Gnns_Index<L2Distance<float>_> *this,Matrix<float> *data)

{
  pointer *pppfVar1;
  size_t_conflict sVar2;
  iterator __position;
  uint uVar3;
  float *local_30;
  
  sVar2 = data->rows;
  this->points_num = sVar2;
  this->vec_len = data->cols;
  if (sVar2 != 0) {
    uVar3 = 0;
    do {
      local_30 = data->data + data->cols * uVar3;
      __position._M_current =
           (this->points).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->points).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float*,std::allocator<float*>>::_M_realloc_insert<float*>
                  ((vector<float*,std::allocator<float*>> *)&this->points,__position,&local_30);
      }
      else {
        *__position._M_current = local_30;
        pppfVar1 = &(this->points).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppfVar1 = *pppfVar1 + 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->points_num);
  }
  return;
}

Assistant:

void setDataset(const Matrix<ElementType>& data)
        {
            this->points_num = data.rows;
            this->vec_len = data.cols;
            for(int i=0;i<points_num;++i)
            {
                points.push_back(data[i]);
            }
        }